

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O3

int add_cert_safe_contents
              (CBB *cbb,X509 *cert,stack_st_X509 *chain,char *name,uint8_t *key_id,size_t key_id_len
              )

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  X509 *cert_00;
  size_t sVar4;
  CBB safe_contents;
  CBB local_60;
  
  iVar1 = CBB_add_asn1(cbb,&local_60,0x20000010);
  iVar2 = 0;
  if (iVar1 != 0) {
    if ((cert != (X509 *)0x0) &&
       (iVar1 = add_cert_bag(&local_60,cert,name,key_id,key_id_len), iVar1 == 0)) {
      return 0;
    }
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)chain);
    if (sVar3 != 0) {
      sVar3 = 0;
      do {
        cert_00 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)chain,sVar3);
        iVar1 = add_cert_bag(&local_60,cert_00,(char *)0x0,(uint8_t *)0x0,0);
        if (iVar1 == 0) {
          return 0;
        }
        sVar3 = sVar3 + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)chain);
      } while (sVar3 < sVar4);
    }
    iVar2 = CBB_flush(cbb);
  }
  return iVar2;
}

Assistant:

static int add_cert_safe_contents(CBB *cbb, X509 *cert,
                                  const STACK_OF(X509) *chain, const char *name,
                                  const uint8_t *key_id, size_t key_id_len) {
  CBB safe_contents;
  if (!CBB_add_asn1(cbb, &safe_contents, CBS_ASN1_SEQUENCE) ||
      (cert != NULL &&
       !add_cert_bag(&safe_contents, cert, name, key_id, key_id_len))) {
    return 0;
  }

  for (size_t i = 0; i < sk_X509_num(chain); i++) {
    // Only the leaf certificate gets attributes.
    if (!add_cert_bag(&safe_contents, sk_X509_value(chain, i), NULL, NULL, 0)) {
      return 0;
    }
  }

  return CBB_flush(cbb);
}